

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osh_filesystem.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  path *ppVar4;
  ostream *poVar5;
  directory_iterator it;
  directory_iterator end;
  char local_71;
  long *local_70 [2];
  long local_60 [3];
  path local_48;
  undefined7 uStack_47;
  long local_38 [3];
  
  if (argc == 4) {
    pcVar1 = argv[1];
    if ((((*pcVar1 == 'r') && (pcVar1[1] == 'm')) && (pcVar1[2] == '\0')) &&
       (((pcVar1 = argv[2], *pcVar1 == '-' && (pcVar1[1] == 'r')) && (pcVar1[2] == '\0')))) {
      Omega_h::filesystem::path::path((path *)local_70,argv[3]);
      Omega_h::filesystem::remove_all((path *)local_70);
LAB_0010145b:
      if (local_70[0] == local_60) {
        return 0;
      }
      operator_delete(local_70[0],local_60[0] + 1);
      return 0;
    }
  }
  else if (argc == 3) {
    pcVar1 = argv[1];
    if (((*pcVar1 == 'r') && (pcVar1[1] == 'm')) && (pcVar1[2] == '\0')) {
      Omega_h::filesystem::path::path((path *)local_70,argv[2]);
      Omega_h::filesystem::remove((path *)local_70);
      goto LAB_0010145b;
    }
  }
  else if (argc == 2) {
    pcVar1 = argv[1];
    iVar3 = strcmp(pcVar1,"pwd");
    if (iVar3 == 0) {
      Omega_h::filesystem::current_path();
      poVar5 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,(path *)local_70);
      local_48 = (path)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_48,1);
      goto LAB_0010145b;
    }
    if (((*pcVar1 == 'l') && (pcVar1[1] == 's')) && (pcVar1[2] == '\0')) {
      Omega_h::filesystem::current_path();
      Omega_h::filesystem::directory_iterator::directory_iterator
                ((directory_iterator *)local_70,&local_48);
      if ((long *)CONCAT71(uStack_47,local_48) != local_38) {
        operator_delete((long *)CONCAT71(uStack_47,local_48),local_38[0] + 1);
      }
      Omega_h::filesystem::directory_iterator::directory_iterator((directory_iterator *)&local_48);
      while (cVar2 = Omega_h::filesystem::directory_iterator::operator==
                               ((directory_iterator *)local_70,(directory_iterator *)&local_48),
            cVar2 == '\0') {
        ppVar4 = (path *)Omega_h::filesystem::directory_iterator::operator->
                                   ((directory_iterator *)local_70);
        poVar5 = (ostream *)Omega_h::filesystem::operator<<((ostream *)&std::cout,ppVar4);
        local_71 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_71,1);
        Omega_h::filesystem::directory_iterator::operator++((directory_iterator *)local_70);
      }
      Omega_h::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&local_48);
      Omega_h::filesystem::directory_iterator::~directory_iterator((directory_iterator *)local_70);
      return 0;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"usage: osh_filesystem pwd\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"       osh_filesystem ls\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"       osh_filesystem rm <file>\n",0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"       osh_filesystem rm -r <dir>\n",0x22);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  if (argc == 2 && 0 == strcmp(argv[1], "pwd")) {
    std::cout << Omega_h::filesystem::current_path() << '\n';
  } else if (argc == 2 && 0 == strcmp(argv[1], "ls")) {
    for (Omega_h::filesystem::directory_iterator
             it(Omega_h::filesystem::current_path()),
         end;
         it != end; ++it) {
      std::cout << it->path() << '\n';
    }
  } else if (argc == 3 && 0 == strcmp(argv[1], "rm")) {
    Omega_h::filesystem::remove(argv[2]);
  } else if (argc == 4 && 0 == strcmp(argv[1], "rm") &&
             0 == strcmp(argv[2], "-r")) {
    Omega_h::filesystem::remove_all(argv[3]);
  } else {
    std::cout << "usage: osh_filesystem pwd\n";
    std::cout << "       osh_filesystem ls\n";
    std::cout << "       osh_filesystem rm <file>\n";
    std::cout << "       osh_filesystem rm -r <dir>\n";
  }
}